

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O1

void __thiscall QtMWidgets::BusyIndicator::paintEvent(BusyIndicator *this,QPaintEvent *param_1)

{
  long lVar1;
  int iVar2;
  double dVar3;
  QPainter p;
  QPainterPath path;
  QConicalGradient gradient;
  undefined1 auStack_98 [8];
  undefined1 local_90 [8];
  QVariant local_88;
  undefined1 local_68 [16];
  double local_58;
  double local_50;
  
  QPainter::QPainter((QPainter *)auStack_98,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)auStack_98,true);
  lVar1 = *(long *)&this->field_0x20;
  iVar2 = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
  local_68._0_8_ = (undefined8)((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1);
  iVar2 = *(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18);
  local_68._8_8_ = (undefined8)((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1);
  QPainter::translate((QPointF *)auStack_98);
  QPainterPath::QPainterPath((QPainterPath *)local_90);
  QPainterPath::setFillRule((FillRule)(QPainterPath *)local_90);
  iVar2 = ((this->d).d)->outerRadius;
  local_68._0_8_ = (undefined8)-iVar2;
  local_58 = (double)(iVar2 * 2);
  local_68._8_8_ = local_68._0_8_;
  local_50 = local_58;
  QPainterPath::addEllipse((QRectF *)local_90);
  iVar2 = ((this->d).d)->innerRadius;
  local_68._0_8_ = (undefined8)-iVar2;
  local_58 = (double)(iVar2 * 2);
  local_68._8_8_ = local_68._0_8_;
  local_50 = local_58;
  QPainterPath::addEllipse((QRectF *)local_90);
  QPainter::setPen((RenderHint)auStack_98);
  QVariantAnimation::currentValue();
  dVar3 = (double)QVariant::toReal((bool *)&local_88);
  QConicalGradient::QConicalGradient((QConicalGradient *)local_68,0.0,0.0,-dVar3);
  QVariant::~QVariant(&local_88);
  QColor::QColor((QColor *)&local_88,transparent);
  QGradient::setColorAt(0.0,(QColor *)local_68);
  QGradient::setColorAt(0.05,(QColor *)local_68);
  QColor::QColor((QColor *)&local_88,transparent);
  QGradient::setColorAt(1.0,(QColor *)local_68);
  QBrush::QBrush((QBrush *)&local_88,(QGradient *)local_68);
  QPainter::setBrush((QBrush *)auStack_98);
  QBrush::~QBrush((QBrush *)&local_88);
  QPainter::drawPath((QPainterPath *)auStack_98);
  QConicalGradient::~QConicalGradient((QConicalGradient *)local_68);
  QPainterPath::~QPainterPath((QPainterPath *)local_90);
  QPainter::~QPainter((QPainter *)auStack_98);
  return;
}

Assistant:

void
BusyIndicator::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.translate( width() / 2, height() / 2 );

	QPainterPath path;
	path.setFillRule( Qt::OddEvenFill );
	path.addEllipse( - d->outerRadius, - d->outerRadius,
		d->outerRadius * 2, d->outerRadius * 2 );
	path.addEllipse( - d->innerRadius, - d->innerRadius,
		d->innerRadius * 2, d->innerRadius * 2 );

	p.setPen( Qt::NoPen );

	QConicalGradient gradient( 0, 0, - d->animation->currentValue().toReal() );
	gradient.setColorAt( 0.0, Qt::transparent );
	gradient.setColorAt( 0.05, d->color );
	gradient.setColorAt( 1.0, Qt::transparent );

	p.setBrush( gradient );

	p.drawPath( path );
}